

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O1

uint32_t ivk::cmd_fread(void *el)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XMLElement *this;
  FILE *__stream;
  _Rb_tree_color _Var2;
  XMLError XVar3;
  _Rb_tree_color _Var4;
  char *pcVar5;
  char *__s;
  char *pcVar6;
  XMLAttribute *this_00;
  size_t sVar7;
  iterator iVar8;
  iterator iVar9;
  uint32_t uVar10;
  bool bVar11;
  int sz;
  int local_54;
  key_type local_50;
  
  this = *el;
  pcVar5 = get_attr_val((XMLElement **)el,"handle");
  __s = get_attr_val((XMLElement **)el,"memory");
  pcVar6 = get_attr_val((XMLElement **)el,"type");
  local_54 = 0;
  this_00 = tinyxml2::XMLElement::FindAttribute(this,"size");
  if (this_00 == (XMLAttribute *)0x0) {
    bVar11 = false;
  }
  else {
    XVar3 = tinyxml2::XMLAttribute::QueryIntValue(this_00,&local_54);
    bVar11 = XVar3 == XML_NO_ERROR;
  }
  uVar10 = 5;
  if (__s != (char *)0x0 && pcVar5 != (char *)0x0) {
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    sVar7 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar5,pcVar5 + sVar7);
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                    *)gCmdMemMap_abi_cxx11_,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    uVar10 = 7;
    if (iVar8._M_node != (_Base_ptr)(gCmdMemMap_abi_cxx11_ + 8)) {
      __stream = (FILE *)iVar8._M_node[2]._M_parent;
      local_50._M_dataplus._M_p = (pointer)paVar1;
      sVar7 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar7);
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                      *)gCmdMemMap_abi_cxx11_,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (iVar8._M_node != (_Base_ptr)(gCmdMemMap_abi_cxx11_ + 8)) {
        pcVar5 = "char";
        if (pcVar6 != (char *)0x0) {
          pcVar5 = pcVar6;
        }
        local_50._M_dataplus._M_p = (pointer)paVar1;
        sVar7 = strlen(pcVar5);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar5,pcVar5 + sVar7);
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        *)gBaseTypeMap_abi_cxx11_,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (iVar9._M_node == (_Base_ptr)(gBaseTypeMap_abi_cxx11_ + 8)) {
          uVar10 = 6;
        }
        else {
          if (bVar11) {
            _Var4 = local_54 * iVar9._M_node[2]._M_color;
            if (iVar8._M_node[2]._M_color <= _Var4) {
              _Var4 = iVar8._M_node[2]._M_color;
            }
          }
          else {
            _Var4 = iVar8._M_node[2]._M_color;
          }
          _Var2 = iVar8._M_node[2]._M_color;
          if (_Var4 < iVar8._M_node[2]._M_color) {
            _Var2 = _Var4;
          }
          sVar7 = fread(iVar8._M_node[2]._M_parent,1,(ulong)_Var2,__stream);
          setret((uint32_t)sVar7);
          uVar10 = 0;
        }
      }
    }
  }
  return uVar10;
}

Assistant:

uint32_t ivk::cmd_fread(void* el){
    XMLElement** ep = (XMLElement**)el;
    XMLElement* e = *(XMLElement**)el;

    const char* hd = get_attr_val(ep,"handle");
    const char* me = get_attr_val(ep,"memory");
    const char* ty = get_attr_val(ep,"type");
    int sz=0;
    XMLError er = e->QueryIntAttribute("size",&sz);
    if(!hd || !me){
        return proc_xml_err;
    }

    // 查找文件句柄
    map<string,proc_data>::iterator it = gCmdMemMap.find(hd);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    FILE* f = (FILE*)it->second.data;

    // 查找内存
    map<string,proc_data>::iterator itm = gCmdMemMap.find(me);
    if(itm==gCmdMemMap.end()){
        return proc_mem_err;
    }

    // 获取类型信息,如果没有指定类型,默认char
    map<string,uint32_t>::iterator itt = gBaseTypeMap.find(ty?ty:"char");
    if(itt==gBaseTypeMap.end()){
        return proc_type_err;
    }
    uint32_t type_size = itt->second;

    // 真正读取的内存空间
    uint32_t mem_size = 0;
    if(er==XML_NO_ERROR){
        if(sz*type_size>itm->second.size){
            mem_size = itm->second.size;
        }else{
            mem_size = sz*type_size;
        }
    }else{
        mem_size = itm->second.size;
    }

    // 如果大小过大则以内存空间大小为准
    if(mem_size>itm->second.size){
        mem_size = itm->second.size;
    }
    uint32_t ret = (uint32_t)fread(itm->second.data,1,mem_size,f);

    // 设置返回值为读取字节大小
    ivk::setret(ret);

    return proc_success;
}